

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O3

void __thiscall Listener::doLoop(Listener *this,actor_ref *param_1,msg_loop *param_2)

{
  actor_ref local_18;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_10;
  
  if ((this->super_actor).field_0x51 == '\x01') {
    this->m_counter = this->m_counter + 1;
    acto::actor_ref::actor_ref(&local_18,&(this->super_actor).self_);
    if (local_18.object_ != (object_t *)0x0) {
      local_10._M_head_impl = (msg_t *)operator_new(0x20);
      ((local_10._M_head_impl)->super_node<acto::core::msg_t>).next = (msg_t *)0x0;
      ((local_10._M_head_impl)->type)._M_target = (type_info *)&msg_loop::typeinfo;
      (local_10._M_head_impl)->sender = (object_t *)0x0;
      (local_10._M_head_impl)->_vptr_msg_t = (_func_int **)&PTR__msg_t_0010ea40;
      acto::actor_ref::send_message
                (&local_18,
                 (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)&local_10
                );
      if (local_10._M_head_impl != (msg_t *)0x0) {
        (*(local_10._M_head_impl)->_vptr_msg_t[1])();
      }
    }
    acto::actor_ref::~actor_ref(&local_18);
  }
  return;
}

Assistant:

void doLoop(acto::actor_ref, const msg_loop&) {
    if (m_active) {
      m_counter++;
      // Продолжить цикл
      self().send(msg_loop());
    }
  }